

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnInfo>
          (Serializer *this,vector<duckdb::ColumnInfo,_true> *vec)

{
  pointer pCVar1;
  long lVar2;
  ColumnInfo *item;
  pointer value;
  
  lVar2 = (long)(vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
                super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
                super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0x30,lVar2 % 0x30);
  pCVar1 = (vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
           super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
               super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
               super__Vector_impl_data._M_start; value != pCVar1; value = value + 1) {
    WriteValue<duckdb::ColumnInfo>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}